

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnn2int8.cpp
# Opt level: O2

int __thiscall NetQuantize::fuse_requantize(NetQuantize *this)

{
  size_type *psVar1;
  int iVar2;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *pvVar3;
  Layer *pLVar4;
  int *piVar5;
  pointer ppLVar6;
  Layer *pLVar7;
  bool bVar8;
  ulong uVar9;
  ulong uVar10;
  size_t i;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong local_58;
  ulong local_50;
  
  pvVar3 = (this->super_ModelWriter).layers;
  uVar10 = (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(pvVar3->super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 3;
  local_58 = 1;
  for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
    bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar11]->type,"Convolution");
    if (bVar8) {
      bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                              "ConvolutionDepthWise");
      if (!bVar8) goto LAB_00143afd;
    }
    else {
LAB_00143afd:
      iVar2 = *((((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar11]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar12 = local_58; uVar12 < uVar10; uVar12 = uVar12 + 1) {
        bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar12]->type,
                                "Convolution");
        if (bVar8) {
          bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar12]->type,
                                  "ConvolutionDepthWise");
          if (!bVar8) goto LAB_00143b56;
        }
        else {
LAB_00143b56:
          pLVar4 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar12];
          piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (((long)*(pointer *)
                      ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl + 8) - (long)piVar5 == 4) && (*piVar5 == iVar2)) break;
        }
      }
      if (uVar10 != uVar12) {
        fprintf(_stderr,"fuse_requantize %s %s\n",
                ((((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar11]->name)._M_dataplus._M_p);
        bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                                "Convolution");
        if (bVar8) {
          bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar12]->type,
                                  "Convolution");
          if (bVar8) {
            ppLVar6 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar11];
            if ((*(long *)&pLVar4[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data != 1) ||
               (pLVar7 = ppLVar6[uVar12],
               *(long *)&pLVar7[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data != 1)) goto LAB_00143b81;
            psVar1 = &pLVar4[1].type._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 100;
            ncnn::Mat::operator=
                      ((Mat *)&pLVar4[3].support_tensor_storage,
                       (Mat *)((long)&pLVar7[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl + 0x10));
          }
        }
        bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                                "Convolution");
        if (bVar8) {
          bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar12]->type,
                                  "ConvolutionDepthWise");
          if (bVar8) {
            ppLVar6 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar11];
            if ((*(long *)&pLVar4[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data != 1) ||
               (pLVar7 = ppLVar6[uVar12],
               *(pointer *)
                ((long)&pLVar7[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) !=
               (pointer)0x1)) goto LAB_00143b81;
            psVar1 = &pLVar4[1].type._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 100;
            ncnn::Mat::operator=
                      ((Mat *)&pLVar4[3].support_tensor_storage,(Mat *)&pLVar7[2].bottom_shapes);
          }
        }
        bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                                "ConvolutionDepthWise");
        if (bVar8) {
          bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar12]->type,
                                  "Convolution");
          if (bVar8) {
            ppLVar6 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar11];
            if ((*(pointer *)
                  ((long)&pLVar4[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) !=
                 (pointer)0x1) ||
               (pLVar7 = ppLVar6[uVar12],
               *(long *)&pLVar7[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data != 1)) goto LAB_00143b81;
            piVar5 = (int *)((long)&pLVar4[1].type._M_string_length + 4);
            *piVar5 = *piVar5 + 100;
            ncnn::Mat::operator=
                      ((Mat *)&pLVar4[3].support_reserved_6,
                       (Mat *)((long)&pLVar7[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl + 0x10));
          }
        }
        bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                                "ConvolutionDepthWise");
        if (bVar8) {
          bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar12]->type,
                                  "ConvolutionDepthWise");
          if (bVar8) {
            ppLVar6 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar11];
            if ((*(pointer *)
                  ((long)&pLVar4[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) ==
                 (pointer)0x1) &&
               (pLVar7 = ppLVar6[uVar12],
               *(pointer *)
                ((long)&pLVar7[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) ==
               (pointer)0x1)) {
              piVar5 = (int *)((long)&pLVar4[1].type._M_string_length + 4);
              *piVar5 = *piVar5 + 100;
              ncnn::Mat::operator=
                        ((Mat *)&pLVar4[3].support_reserved_6,(Mat *)&pLVar7[2].bottom_shapes);
            }
          }
        }
      }
    }
LAB_00143b81:
    local_58 = local_58 + 1;
  }
  local_50 = 2;
  uVar11 = 0;
  do {
    if (uVar11 == uVar10) {
      return 0;
    }
    bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                             super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                             _M_impl.super__Vector_impl_data._M_start[uVar11]->type,"Convolution");
    if (bVar8) {
      bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                               super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                               _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                              "ConvolutionDepthWise");
      if (!bVar8) goto LAB_00143e3b;
    }
    else {
LAB_00143e3b:
      iVar2 = *((((this->super_ModelWriter).layers)->
                super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar11]->tops).
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      for (uVar12 = local_50; uVar12 - 1 < uVar10; uVar12 = uVar12 + 1) {
        bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar12 - 1]->type,"Split")
        ;
        if (((!bVar8) &&
            (pLVar4 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start[uVar12 - 1],
            piVar5 = (pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            (long)*(pointer *)
                   ((long)&(pLVar4->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl +
                   8) - (long)piVar5 == 4)) && (*piVar5 == iVar2)) break;
      }
      if ((1 - uVar10) + uVar12 != 2) {
        pLVar4 = (((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar12 - 1];
        for (uVar9 = 0;
            piVar5 = (pLVar4->tops).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start,
            uVar9 < (ulong)((long)*(pointer *)
                                   ((long)&(pLVar4->tops).
                                           super__Vector_base<int,_std::allocator<int>_>._M_impl + 8
                                   ) - (long)piVar5 >> 2); uVar9 = uVar9 + 1) {
          iVar2 = piVar5[uVar9];
          for (uVar13 = uVar12; uVar13 < uVar10; uVar13 = uVar13 + 1) {
            bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                     super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                     )._M_impl.super__Vector_impl_data._M_start[uVar13]->type,
                                    "Convolution");
            if (bVar8) {
              bVar8 = std::operator!=(&(((this->super_ModelWriter).layers)->
                                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                       )._M_impl.super__Vector_impl_data._M_start[uVar13]->type,
                                      "ConvolutionDepthWise");
              if (!bVar8) goto LAB_00143f55;
            }
            else {
LAB_00143f55:
              pLVar7 = (((this->super_ModelWriter).layers)->
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar13];
              piVar5 = (pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              if (((long)*(pointer *)
                          ((long)&(pLVar7->bottoms).super__Vector_base<int,_std::allocator<int>_>.
                                  _M_impl + 8) - (long)piVar5 == 4) && (*piVar5 == iVar2)) break;
            }
          }
          if ((2 - uVar10) + uVar13 == 2) goto LAB_00143ec2;
          bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[uVar13]->type,
                                  "Convolution");
          pLVar7 = (((this->super_ModelWriter).layers)->
                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar13];
          if ((bVar8) &&
             (*(long *)&pLVar7[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                        super__Vector_impl_data != 1)) goto LAB_00143ec2;
          bVar8 = std::operator==(&pLVar7->type,"ConvolutionDepthWise");
          if ((bVar8) &&
             (*(pointer *)
               ((long)&(((this->super_ModelWriter).layers)->
                       super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar13][1].bottom_shapes.
                       super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) !=
              (pointer)0x1)) goto LAB_00143ec2;
        }
        iVar2 = (((this->super_ModelWriter).blobs)->
                super__Vector_base<ncnn::Blob,_std::allocator<ncnn::Blob>_>)._M_impl.
                super__Vector_impl_data._M_start[*piVar5].consumer;
        fprintf(_stderr,"fuse_requantize %s %s\n",
                ((((this->super_ModelWriter).layers)->
                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                 super__Vector_impl_data._M_start[uVar11]->name)._M_dataplus._M_p,
                (pLVar4->name)._M_dataplus._M_p);
        bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                                "Convolution");
        if (bVar8) {
          bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar2]->type,
                                  "Convolution");
          if (bVar8) {
            ppLVar6 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar11];
            if ((*(long *)&pLVar4[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data != 1) ||
               (pLVar7 = ppLVar6[iVar2],
               *(long *)&pLVar7[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data != 1)) goto LAB_00143ec2;
            psVar1 = &pLVar4[1].type._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 100;
            ncnn::Mat::operator=
                      ((Mat *)&pLVar4[3].support_tensor_storage,
                       (Mat *)((long)&pLVar7[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl + 0x10));
          }
        }
        bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                                "Convolution");
        if (bVar8) {
          bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar2]->type,
                                  "ConvolutionDepthWise");
          if (bVar8) {
            ppLVar6 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar11];
            if ((*(long *)&pLVar4[1].bottom_shapes.
                           super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                           super__Vector_impl_data != 1) ||
               (pLVar7 = ppLVar6[iVar2],
               *(pointer *)
                ((long)&pLVar7[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) !=
               (pointer)0x1)) goto LAB_00143ec2;
            psVar1 = &pLVar4[1].type._M_string_length;
            *(int *)psVar1 = (int)*psVar1 + 100;
            ncnn::Mat::operator=
                      ((Mat *)&pLVar4[3].support_tensor_storage,(Mat *)&pLVar7[2].bottom_shapes);
          }
        }
        bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                                "ConvolutionDepthWise");
        if (bVar8) {
          bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar2]->type,
                                  "Convolution");
          if (bVar8) {
            ppLVar6 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar11];
            if ((*(pointer *)
                  ((long)&pLVar4[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) !=
                 (pointer)0x1) ||
               (pLVar7 = ppLVar6[iVar2],
               *(long *)&pLVar7[1].bottom_shapes.
                         super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl.
                         super__Vector_impl_data != 1)) goto LAB_00143ec2;
            piVar5 = (int *)((long)&pLVar4[1].type._M_string_length + 4);
            *piVar5 = *piVar5 + 100;
            ncnn::Mat::operator=
                      ((Mat *)&pLVar4[3].support_reserved_6,
                       (Mat *)((long)&pLVar7[2].tops.super__Vector_base<int,_std::allocator<int>_>.
                                      _M_impl + 0x10));
          }
        }
        bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                 super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[uVar11]->type,
                                "ConvolutionDepthWise");
        if (bVar8) {
          bVar8 = std::operator==(&(((this->super_ModelWriter).layers)->
                                   super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start[iVar2]->type,
                                  "ConvolutionDepthWise");
          if (bVar8) {
            ppLVar6 = (((this->super_ModelWriter).layers)->
                      super__Vector_base<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>)._M_impl.
                      super__Vector_impl_data._M_start;
            pLVar4 = ppLVar6[uVar11];
            if ((*(pointer *)
                  ((long)&pLVar4[1].bottom_shapes.
                          super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) ==
                 (pointer)0x1) &&
               (pLVar7 = ppLVar6[iVar2],
               *(pointer *)
                ((long)&pLVar7[1].bottom_shapes.
                        super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>._M_impl + 8) ==
               (pointer)0x1)) {
              piVar5 = (int *)((long)&pLVar4[1].type._M_string_length + 4);
              *piVar5 = *piVar5 + 100;
              ncnn::Mat::operator=
                        ((Mat *)&pLVar4[3].support_reserved_6,(Mat *)&pLVar7[2].bottom_shapes);
            }
          }
        }
      }
    }
LAB_00143ec2:
    uVar11 = uVar11 + 1;
    local_50 = local_50 + 1;
  } while( true );
}

Assistant:

int NetQuantize::fuse_requantize()
{
    const size_t layer_count = layers.size();
    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Convolution" && layers[j]->type != "ConvolutionDepthWise")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), layers[j]->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    for (size_t i = 0; i < layer_count; i++)
    {
        if (layers[i]->type != "Convolution" && layers[i]->type != "ConvolutionDepthWise")
            continue;

        // Convolution/ConvolutionDepthWise - Split - Convolution/ConvolutionDepthWise
        int top_blob_index = layers[i]->tops[0];

        size_t j = i + 1;
        for (; j < layer_count; j++)
        {
            if (layers[j]->type != "Split")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Split* split = (ncnn::Split*)layers[j];

        bool all_conv = true;
        for (size_t p = 0; p < split->tops.size(); p++)
        {
            int split_top_blob_index = split->tops[p];

            size_t k = j + 1;
            for (; k < layer_count; k++)
            {
                if (layers[k]->type != "Convolution" && layers[k]->type != "ConvolutionDepthWise")
                    continue;

                if (layers[k]->bottoms.size() != 1)
                    continue;

                if (layers[k]->bottoms[0] == split_top_blob_index)
                    break;
            }

            if (k == layer_count)
            {
                all_conv = false;
                break;
            }

            if (layers[k]->type == "Convolution")
            {
                ncnn::Convolution* convolution = (ncnn::Convolution*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
            if (layers[k]->type == "ConvolutionDepthWise")
            {
                ncnn::ConvolutionDepthWise* convolution = (ncnn::ConvolutionDepthWise*)layers[k];
                if (convolution->weight_data.elemsize != 1u)
                {
                    all_conv = false;
                    break;
                }
            }
        }

        if (!all_conv)
            continue;

        j = blobs[split->tops[0]].consumer;

        // fuse requantize
        fprintf(stderr, "fuse_requantize %s %s\n", layers[i]->name.c_str(), split->name.c_str());

        if (layers[i]->type == "Convolution" && layers[j]->type == "Convolution")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "Convolution" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::Convolution* convolution1 = (ncnn::Convolution*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "Convolution")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::Convolution* convolution2 = (ncnn::Convolution*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
        if (layers[i]->type == "ConvolutionDepthWise" && layers[j]->type == "ConvolutionDepthWise")
        {
            ncnn::ConvolutionDepthWise* convolution1 = (ncnn::ConvolutionDepthWise*)layers[i];
            ncnn::ConvolutionDepthWise* convolution2 = (ncnn::ConvolutionDepthWise*)layers[j];

            if (convolution1->weight_data.elemsize != 1u || convolution2->weight_data.elemsize != 1u)
                continue;

            convolution1->int8_scale_term += 100;
            convolution1->top_blob_int8_scales = convolution2->bottom_blob_int8_scales;
        }
    }

    return 0;
}